

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

uv_loop_t * uv_loop_new(void)

{
  int iVar1;
  uv_loop_t *loop;
  int *piVar2;
  
  loop = (uv_loop_t *)(*(code *)uv__allocator_0)(0x328);
  if (loop != (uv_loop_t *)0x0) {
    iVar1 = uv_loop_init(loop);
    if (iVar1 == 0) {
      return loop;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    (*(code *)uv__allocator_3)(loop);
    *piVar2 = iVar1;
  }
  return (uv_loop_t *)0x0;
}

Assistant:

uv_loop_t* uv_loop_new(void) {
  uv_loop_t* loop;

  loop = uv__malloc(sizeof(*loop));
  if (loop == NULL)
    return NULL;

  if (uv_loop_init(loop)) {
    uv__free(loop);
    return NULL;
  }

  return loop;
}